

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAccount.cpp
# Opt level: O2

void __thiscall jbcoin::STAccount::STAccount(STAccount *this,SerialIter *sit,SField *name)

{
  Buffer BStack_28;
  
  SerialIter::getVLBuffer((SerialIter *)&BStack_28);
  STAccount(this,name,&BStack_28);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            (&BStack_28.p_);
  return;
}

Assistant:

STAccount::STAccount (SerialIter& sit, SField const& name)
    : STAccount(name, sit.getVLBuffer())
{
}